

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::StrPair::GetStr(StrPair *this)

{
  int iVar1;
  char *pcVar2;
  char *p_00;
  long lVar3;
  uint *in_RDI;
  Entity *entity;
  int i;
  bool entityFound;
  char *adjusted;
  int len;
  char buf [10];
  int buflen;
  char *q;
  char *p;
  int in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  char *local_10;
  
  if ((*in_RDI & 0x100) != 0) {
    **(undefined1 **)(in_RDI + 4) = 0;
    *in_RDI = *in_RDI ^ 0x100;
    if (*in_RDI != 0) {
      p_00 = *(char **)(in_RDI + 2);
      local_10 = *(char **)(in_RDI + 2);
      while (local_10 < *(char **)(in_RDI + 4)) {
        if (((*in_RDI & 2) == 0) || (*local_10 != '\r')) {
          if (((*in_RDI & 2) == 0) || (*local_10 != '\n')) {
            if (((*in_RDI & 1) == 0) || (*local_10 != '&')) {
              *p_00 = *local_10;
              p_00 = p_00 + 1;
              local_10 = local_10 + 1;
            }
            else if (local_10[1] == '#') {
              uVar4 = 10;
              memset(&stack0xffffffffffffffda,0,10);
              pcVar2 = XMLUtil::GetCharacterRef
                                 (p_00,(char *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),
                                  in_stack_ffffffffffffffd8);
              if (pcVar2 == (char *)0x0) {
                *p_00 = *local_10;
                p_00 = p_00 + 1;
                local_10 = local_10 + 1;
              }
              else {
                memcpy(p_00,&stack0xffffffffffffffda,0);
                local_10 = pcVar2;
              }
            }
            else {
              in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
              for (in_stack_ffffffffffffffc0 = 0; in_stack_ffffffffffffffc0 < 5;
                  in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
                lVar3 = (long)in_stack_ffffffffffffffc0 * 0x10;
                iVar1 = strncmp(local_10 + 1,*(char **)(entities + lVar3),
                                (long)*(int *)(entities + lVar3 + 8));
                if ((iVar1 == 0) && (local_10[(long)*(int *)(entities + lVar3 + 8) + 1] == ';')) {
                  *p_00 = entities[lVar3 + 0xc];
                  p_00 = p_00 + 1;
                  local_10 = local_10 + (*(int *)(entities + lVar3 + 8) + 2);
                  in_stack_ffffffffffffffc4 = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
                  break;
                }
              }
              if ((in_stack_ffffffffffffffc4 & 0x1000000) == 0) {
                p_00 = p_00 + 1;
                local_10 = local_10 + 1;
              }
            }
          }
          else {
            if (local_10[1] == '\r') {
              local_10 = local_10 + 2;
            }
            else {
              local_10 = local_10 + 1;
            }
            *p_00 = '\n';
            p_00 = p_00 + 1;
          }
        }
        else {
          if (local_10[1] == '\n') {
            local_10 = local_10 + 2;
          }
          else {
            local_10 = local_10 + 1;
          }
          *p_00 = '\n';
          p_00 = p_00 + 1;
        }
      }
      *p_00 = '\0';
    }
    if ((*in_RDI & 4) != 0) {
      CollapseWhitespace((StrPair *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    *in_RDI = *in_RDI & 0x200;
  }
  return *(char **)(in_RDI + 2);
}

Assistant:

const char* StrPair::GetStr()
{
    TIXMLASSERT( _start );
    TIXMLASSERT( _end );
    if ( _flags & NEEDS_FLUSH ) {
        *_end = 0;
        _flags ^= NEEDS_FLUSH;

        if ( _flags ) {
            char* p = _start;	// the read pointer
            char* q = _start;	// the write pointer

            while( p < _end ) {
                if ( (_flags & NEEDS_NEWLINE_NORMALIZATION) && *p == CR ) {
                    // CR-LF pair becomes LF
                    // CR alone becomes LF
                    // LF-CR becomes LF
                    if ( *(p+1) == LF ) {
                        p += 2;
                    }
                    else {
                        ++p;
                    }
                    *q++ = LF;
                }
                else if ( (_flags & NEEDS_NEWLINE_NORMALIZATION) && *p == LF ) {
                    if ( *(p+1) == CR ) {
                        p += 2;
                    }
                    else {
                        ++p;
                    }
                    *q++ = LF;
                }
                else if ( (_flags & NEEDS_ENTITY_PROCESSING) && *p == '&' ) {
                    // Entities handled by tinyXML2:
                    // - special entities in the entity table [in/out]
                    // - numeric character reference [in]
                    //   &#20013; or &#x4e2d;

                    if ( *(p+1) == '#' ) {
                        const int buflen = 10;
                        char buf[buflen] = { 0 };
                        int len = 0;
                        char* adjusted = const_cast<char*>( XMLUtil::GetCharacterRef( p, buf, &len ) );
                        if ( adjusted == 0 ) {
                            *q = *p;
                            ++p;
                            ++q;
                        }
                        else {
                            TIXMLASSERT( 0 <= len && len <= buflen );
                            TIXMLASSERT( q + len <= adjusted );
                            p = adjusted;
                            memcpy( q, buf, len );
                            q += len;
                        }
                    }
                    else {
                        bool entityFound = false;
                        for( int i = 0; i < NUM_ENTITIES; ++i ) {
                            const Entity& entity = entities[i];
                            if ( strncmp( p + 1, entity.pattern, entity.length ) == 0
                                    && *( p + entity.length + 1 ) == ';' ) {
                                // Found an entity - convert.
                                *q = entity.value;
                                ++q;
                                p += entity.length + 2;
                                entityFound = true;
                                break;
                            }
                        }
                        if ( !entityFound ) {
                            // fixme: treat as error?
                            ++p;
                            ++q;
                        }
                    }
                }
                else {
                    *q = *p;
                    ++p;
                    ++q;
                }
            }
            *q = 0;
        }
        // The loop below has plenty going on, and this
        // is a less useful mode. Break it out.
        if ( _flags & NEEDS_WHITESPACE_COLLAPSING ) {
            CollapseWhitespace();
        }
        _flags = (_flags & NEEDS_DELETE);
    }
    TIXMLASSERT( _start );
    return _start;
}